

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

CollectCallBack * __thiscall
DListBase<ThreadContext::CollectCallBack,_RealCount>::PrependNode<Memory::HeapAllocator>
          (DListBase<ThreadContext::CollectCallBack,_RealCount> *this,HeapAllocator *allocator)

{
  DListNodeBase<ThreadContext::CollectCallBack> *pDVar1;
  HeapAllocator *alloc;
  DListNodeBase<ThreadContext::CollectCallBack> *pDVar2;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&DListNode<ThreadContext::CollectCallBack>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26dcec;
  data.filename._0_4_ = 0x10a;
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_38);
  pDVar2 = (DListNodeBase<ThreadContext::CollectCallBack> *)
           new<Memory::HeapAllocator>(0x20,alloc,0x2f6726);
  pDVar2[1].next.base = (DListNodeBase<ThreadContext::CollectCallBack> *)0x0;
  pDVar2[1].prev.base = (DListNodeBase<ThreadContext::CollectCallBack> *)0x0;
  pDVar1 = (this->super_DListNodeBase<ThreadContext::CollectCallBack>).next.base;
  pDVar2->prev = pDVar1->prev;
  (pDVar2->next).base = pDVar1;
  *(DListNodeBase<ThreadContext::CollectCallBack> **)pDVar1->prev = pDVar2;
  (pDVar1->prev).base = pDVar2;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return (CollectCallBack *)(pDVar2 + 1);
}

Assistant:

TData * PrependNode(TAllocator * allocator)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }